

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O1

string * __thiscall
RenX_ServerListPlugin::server_as_long_json_abi_cxx11_
          (string *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type __n;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  char cVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char *pcVar13;
  char *pcVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  long *plVar22;
  pointer pbVar23;
  char *pcVar24;
  undefined8 uVar25;
  string_view sVar26;
  string_view in_str;
  string_view in_str_00;
  string_view in_str_01;
  string_view in_str_02;
  string_view in_str_03;
  string_view in_str_04;
  string local_220;
  string server_json_block;
  vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> activePlayers;
  long *local_1d8;
  long local_1d0;
  string server_attributes;
  string server_prefix;
  string server_version;
  string server_map;
  string server_name;
  ListServerInfo serverInfo;
  
  getListServerInfo(&serverInfo,this,server);
  sVar26 = (string_view)RenX::Server::getName();
  jsonify_abi_cxx11_(&server_name,sVar26);
  lVar10 = RenX::Server::getMap();
  sVar26._M_str = *(char **)(lVar10 + 0x10);
  sVar26._M_len = *(size_t *)(lVar10 + 0x18);
  jsonify_abi_cxx11_(&server_map,sVar26);
  sVar26 = (string_view)RenX::Server::getGameVersion();
  jsonify_abi_cxx11_(&server_version,sVar26);
  jsonify_abi_cxx11_(&server_prefix,serverInfo.namePrefix);
  RenX::Server::activePlayers(SUB81(&activePlayers,0));
  server_attributes._M_dataplus._M_p = (pointer)&server_attributes.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&server_attributes,"[]","");
  if (serverInfo.attributes.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      serverInfo.attributes.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&server_attributes,
               (long)serverInfo.attributes.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
               (0x10 - (long)serverInfo.attributes.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&server_attributes,0,server_attributes._M_string_length,"[",1);
    if (serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar19 = "\n";
      pbVar23 = serverInfo.attributes.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        __n = pbVar23->_M_len;
        pcVar24 = pbVar23->_M_str;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,pcVar19);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,"\t\t\t\"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,pcVar24,__n);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,"\"");
        pbVar23 = pbVar23 + 1;
        pcVar19 = ",\n";
      } while (pbVar23 !=
               serverInfo.attributes.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_attributes,"\n\t\t],");
  }
  _Var6._M_p = server_name._M_dataplus._M_p;
  _Var5._M_p = server_map._M_dataplus._M_p;
  _Var3._M_p = server_prefix._M_dataplus._M_p;
  uVar11 = RenX::Server::getBotCount();
  _Var4 = server_version._M_dataplus;
  _Var2 = server_attributes._M_dataplus;
  lVar10 = (long)local_1d8 - (long)_activePlayers;
  uVar12 = RenX::Server::getMineLimit();
  cVar7 = RenX::Server::isSteamRequired();
  pcVar24 = "false";
  pcVar19 = "false";
  if (cVar7 != '\0') {
    pcVar19 = "true";
  }
  cVar7 = RenX::Server::isPrivateMessageTeamOnly();
  pcVar13 = "false";
  if (cVar7 != '\0') {
    pcVar13 = "true";
  }
  cVar7 = RenX::Server::isPassworded();
  pcVar14 = "false";
  if (cVar7 != '\0') {
    pcVar14 = "true";
  }
  cVar7 = RenX::Server::isPrivateMessagingEnabled();
  pcVar20 = "false";
  if (cVar7 != '\0') {
    pcVar20 = "true";
  }
  uVar15 = RenX::Server::getPlayerLimit();
  uVar16 = RenX::Server::getVehicleLimit();
  iVar8 = RenX::Server::getTeamMode();
  pcVar18 = "false";
  if (iVar8 == 3) {
    pcVar18 = "true";
  }
  uVar17 = RenX::Server::getTeamMode();
  cVar7 = RenX::Server::isCratesEnabled();
  if (cVar7 != '\0') {
    pcVar24 = "true";
  }
  uVar25 = RenX::Server::getCrateRespawnDelay();
  uVar9 = RenX::Server::getTimeLimit();
  string_printf_abi_cxx11_
            (&server_json_block,
             "{\n\t\t\"Name\": \"%.*s\",\n\t\t\"NamePrefix\": \"%.*s\",\n\t\t\"Current Map\": \"%.*s\",\n\t\t\"Bots\": %u,\n\t\t\"Players\": %u,\n\t\t\"Game Version\": \"%.*s\",\n\t\t\"Attributes\": %.*s,\n\t\t\"Variables\": {\n\t\t\t\"Mine Limit\": %d,\n\t\t\t\"bSteamRequired\": %s,\n\t\t\t\"bPrivateMessageTeamOnly\": %s,\n\t\t\t\"bPassworded\": %s,\n\t\t\t\"bAllowPrivateMessaging\": %s,\n\t\t\t\"Player Limit\": %d,\n\t\t\t\"Vehicle Limit\": %d,\n\t\t\t\"bAutoBalanceTeams\": %s,\n\t\t\t\"Team Mode\": %d,\n\t\t\t\"bSpawnCrates\": %s,\n\t\t\t\"CrateRespawnAfterPickup\": %f,\n\t\t\t\"Time Limit\": %d\n\t\t},\n\t\t\"Port\": %u,\n\t\t\"IP\": \"%.*s\""
             ,uVar25,server_name._M_string_length,_Var6._M_p,server_prefix._M_string_length,
             _Var3._M_p,server_map._M_string_length,_Var5._M_p,uVar11,lVar10 >> 3,
             server_version._M_string_length,_Var4._M_p,server_attributes._M_string_length,
             _Var2._M_p,uVar12,pcVar19,pcVar13,pcVar14,pcVar20,uVar15,uVar16,pcVar18,uVar17,pcVar24,
             (ulong)uVar9,(ulong)serverInfo.port,serverInfo.hostname._M_len,
             serverInfo.hostname._M_str);
  if (*(long *)(server + 0x60) != *(long *)(server + 0x58)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,",\n\t\t\"Levels\": [",0xf);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x13);
    in_str._M_str = *(char **)(*(long *)(server + 0x58) + 0x10);
    in_str._M_len = *(size_t *)(*(long *)(server + 0x58) + 0x18);
    jsonify_abi_cxx11_(&local_220,in_str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
    paVar1 = &local_220.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\",\n\t\t\t\t\"GUID\": \"",0x10);
    RenX::formatGUID_abi_cxx11_((Map *)&local_220);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\"\n\t\t\t}",6);
    if (*(long *)(server + 0x60) - *(long *)(server + 0x58) != 0x30) {
      lVar21 = 1;
      lVar10 = 0x30;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_json_block,",\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x14);
        in_str_00._M_str = *(char **)(*(long *)(server + 0x58) + 0x10 + lVar10);
        in_str_00._M_len = *(size_t *)(*(long *)(server + 0x58) + 0x18 + lVar10);
        jsonify_abi_cxx11_(&local_220,in_str_00);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_json_block,"\",\n\t\t\t\t\"GUID\": \"",0x10);
        RenX::formatGUID_abi_cxx11_((Map *)&local_220);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_json_block,"\"\n\t\t\t}",6);
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + 0x30;
      } while (lVar21 != (*(long *)(server + 0x60) - *(long *)(server + 0x58) >> 4) *
                         -0x5555555555555555);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\n\t\t]",4);
  }
  if (*(long *)(server + 0x48) != *(long *)(server + 0x40)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,",\n\t\t\"Mutators\": [",0x11);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x13);
    in_str_01._M_str = (char *)**(undefined8 **)(server + 0x40);
    in_str_01._M_len = (*(undefined8 **)(server + 0x40))[1];
    jsonify_abi_cxx11_(&local_220,in_str_01);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\"\n\t\t\t}",6);
    if (*(long *)(server + 0x48) - *(long *)(server + 0x40) != 0x20) {
      lVar21 = 1;
      lVar10 = 0x28;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_json_block,",\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x14);
        in_str_02._M_str = *(char **)(*(long *)(server + 0x40) + -8 + lVar10);
        in_str_02._M_len = *(size_t *)(*(long *)(server + 0x40) + lVar10);
        jsonify_abi_cxx11_(&local_220,in_str_02);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_json_block,"\"\n\t\t\t}",6);
        lVar21 = lVar21 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar21 != *(long *)(server + 0x48) - *(long *)(server + 0x40) >> 5);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\n\t\t]",4);
  }
  if (local_1d8 != _activePlayers) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,",\n\t\t\"PlayerList\": [",0x13);
    plVar22 = _activePlayers;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x13);
    in_str_03._M_str = *(char **)(*plVar22 + 8);
    in_str_03._M_len = *(size_t *)(*plVar22 + 0x10);
    jsonify_abi_cxx11_(&local_220,in_str_03);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\"\n\t\t\t}",6);
    while (plVar22 = plVar22 + 1, plVar22 != local_1d8) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_json_block,",\n\t\t\t{\n\t\t\t\t\"Name\": \"",0x14);
      in_str_04._M_str = *(char **)(*plVar22 + 8);
      in_str_04._M_len = *(size_t *)(*plVar22 + 0x10);
      jsonify_abi_cxx11_(&local_220,in_str_04);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&server_json_block,local_220._M_dataplus._M_p,local_220._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&server_json_block,"\"\n\t\t\t}",6);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&server_json_block,"\n\t\t]",4);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&server_json_block,"\n\t}",3);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,server_json_block._M_dataplus._M_p,
             server_json_block._M_dataplus._M_p + server_json_block._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_json_block._M_dataplus._M_p != &server_json_block.field_2) {
    operator_delete(server_json_block._M_dataplus._M_p,
                    server_json_block.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_attributes._M_dataplus._M_p != &server_attributes.field_2) {
    operator_delete(server_attributes._M_dataplus._M_p,
                    server_attributes.field_2._M_allocated_capacity + 1);
  }
  if (_activePlayers != (long *)0x0) {
    operator_delete(_activePlayers,local_1d0 - (long)_activePlayers);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_prefix._M_dataplus._M_p != &server_prefix.field_2) {
    operator_delete(server_prefix._M_dataplus._M_p,server_prefix.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_version._M_dataplus._M_p != &server_version.field_2) {
    operator_delete(server_version._M_dataplus._M_p,server_version.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_map._M_dataplus._M_p != &server_map.field_2) {
    operator_delete(server_map._M_dataplus._M_p,server_map.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)server_name._M_dataplus._M_p != &server_name.field_2) {
    operator_delete(server_name._M_dataplus._M_p,server_name.field_2._M_allocated_capacity + 1);
  }
  if (serverInfo.attributes.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(serverInfo.attributes.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)serverInfo.attributes.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)serverInfo.attributes.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RenX_ServerListPlugin::server_as_long_json(const RenX::Server &server) {
	ListServerInfo serverInfo = getListServerInfo(server);

	std::string server_name = jsonify(server.getName());
	std::string server_map = jsonify(server.getMap().name);
	std::string server_version = jsonify(server.getGameVersion());
	std::string_view server_hostname = serverInfo.hostname;
	unsigned short server_port = serverInfo.port;
	std::string server_prefix = jsonify(serverInfo.namePrefix);
	std::vector<const RenX::PlayerInfo*> activePlayers = server.activePlayers(false);

	std::string server_attributes = "[]";
	if (!serverInfo.attributes.empty()) {
		server_attributes.reserve(16 * serverInfo.attributes.size() + 16);
		server_attributes = "[";

		const char* comma = "\n";
		for (std::string_view attribute : serverInfo.attributes) {
			server_attributes += comma;
			comma = ",\n";

			server_attributes += "\t\t\t\"";
			server_attributes += attribute;
			server_attributes += "\"";
		}

		server_attributes += "\n\t\t],";
	}

	std::string server_json_block = string_printf(R"json({
		"Name": "%.*s",
		"NamePrefix": "%.*s",
		"Current Map": "%.*s",
		"Bots": %u,
		"Players": %u,
		"Game Version": "%.*s",
		"Attributes": %.*s,
		"Variables": {
			"Mine Limit": %d,
			"bSteamRequired": %s,
			"bPrivateMessageTeamOnly": %s,
			"bPassworded": %s,
			"bAllowPrivateMessaging": %s,
			"Player Limit": %d,
			"Vehicle Limit": %d,
			"bAutoBalanceTeams": %s,
			"Team Mode": %d,
			"bSpawnCrates": %s,
			"CrateRespawnAfterPickup": %f,
			"Time Limit": %d
		},
		"Port": %u,
		"IP": "%.*s")json",
		server_name.size(), server_name.data(),
		server_prefix.size(), server_prefix.data(),
		server_map.size(), server_map.data(),
		server.getBotCount(),
		activePlayers.size(),
		server_version.size(), server_version.data(),
		server_attributes.size(), server_attributes.data(),

		server.getMineLimit(),
		json_bool_as_cstring(server.isSteamRequired()),
		json_bool_as_cstring(server.isPrivateMessageTeamOnly()),
		json_bool_as_cstring(server.isPassworded()),
		json_bool_as_cstring(server.isPrivateMessagingEnabled()),
		server.getPlayerLimit(),
		server.getVehicleLimit(),
		json_bool_as_cstring(server.getTeamMode() == 3),
		server.getTeamMode(),
		json_bool_as_cstring(server.isCratesEnabled()),
		server.getCrateRespawnDelay(),
		server.getTimeLimit(),

		server_port,
		server_hostname.size(), server_hostname.data());

	// Level Rotation
	if (server.maps.size() != 0) {
		server_json_block += ",\n\t\t\"Levels\": ["sv;

		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify(server.maps[0].name);
		server_json_block += "\",\n\t\t\t\t\"GUID\": \""sv;
		server_json_block += RenX::formatGUID(server.maps[0]);
		server_json_block += "\"\n\t\t\t}"sv;

		for (size_t index = 1; index != server.maps.size(); ++index) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify(server.maps[index].name);
			server_json_block += "\",\n\t\t\t\t\"GUID\": \""sv;
			server_json_block += RenX::formatGUID(server.maps[index]);
			server_json_block += "\"\n\t\t\t}"sv;
		}

		server_json_block += "\n\t\t]"sv;
	}

	// Mutators
	if (server.mutators.size() != 0) {
		server_json_block += ",\n\t\t\"Mutators\": ["sv;

		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify(server.mutators[0]);
		server_json_block += "\"\n\t\t\t}"sv;

		for (size_t index = 1; index != server.mutators.size(); ++index) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify(server.mutators[index]);
			server_json_block += "\"\n\t\t\t}"sv;
		}

		server_json_block += "\n\t\t]"sv;
	}

	// Player List
	if (activePlayers.size() != 0) {
		server_json_block += ",\n\t\t\"PlayerList\": ["sv;

		auto node = activePlayers.begin();

		// Add first player to JSON
		server_json_block += "\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
		server_json_block += jsonify((*node)->name);
		server_json_block += "\"\n\t\t\t}"sv;
		++node;

		// Add remaining players to JSON
		while (node != activePlayers.end()) {
			server_json_block += ",\n\t\t\t{\n\t\t\t\t\"Name\": \""sv;
			server_json_block += jsonify((*node)->name);
			server_json_block += "\"\n\t\t\t}"sv;
			++node;
		}

		server_json_block += "\n\t\t]"sv;
	}

	server_json_block += "\n\t}"sv;

	return static_cast<std::string>(server_json_block);
}